

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

void __thiscall nite::Texture::Texture(Texture *this,string *path,Color *transparency)

{
  Vec2 in_RAX;
  Vec2 local_28;
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  local_28 = in_RAX;
  Vec2::Vec2(&this->scale);
  Rect::Rect(&this->region);
  this->objectId = -1;
  this->smooth = false;
  Vec2::Vec2(&local_28,1.0,1.0);
  this->scale = local_28;
  load(this,path,transparency);
  return;
}

Assistant:

nite::Texture::Texture(const String &path, const nite::Color &transparency){
	objectId = -1;
	smooth = false;
	scale = nite::Vec2(1, 1);
	load(path, transparency);
}